

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O1

TPZTransform<double> *
pztopology::TPZTetrahedron::SideToSideTransform
          (TPZTransform<double> *__return_storage_ptr__,int sidefrom,int sideto)

{
  uint col;
  uint row;
  uint uVar1;
  ostream *poVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  int dim;
  char *pcVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  char local_52;
  char local_51;
  double local_50;
  ulong local_48;
  ulong local_40;
  undefined1 *local_38;
  
  if ((uint)sidefrom < 0xf && (uint)sideto < 0xf) {
    lVar5 = (long)sidefrom;
    if (sidefrom == sideto) {
      dim = *(int *)(sidedimension + lVar5 * 4);
      goto LAB_00dff72d;
    }
    if (sidefrom == 0xe) {
      TransformElementToSide(__return_storage_ptr__,sideto);
      return __return_storage_ptr__;
    }
    uVar4 = 1;
    if (1 < (int)*(uint *)(nhighdimsides + lVar5 * 4)) {
      uVar4 = (ulong)*(uint *)(nhighdimsides + lVar5 * 4);
    }
    local_50 = (double)(lVar5 * 0x2a0);
    pdVar9 = (double *)(sidetosidetransforms + (long)local_50);
    uVar7 = 0;
    do {
      local_48 = lVar5;
      if (*(int *)(pztopology::highsides + uVar7 * 4 + lVar5 * 0x1c) == sideto) {
        col = *(uint *)(sidedimension + lVar5 * 4);
        row = *(uint *)(sidedimension + (long)sideto * 4);
        TPZTransform<double>::TPZTransform(__return_storage_ptr__,row,col);
        if (10 < (long)sideto - 4U) {
          return __return_storage_ptr__;
        }
        local_48 = local_48 - 4;
        if ((int)col < 2) {
          col = 1;
        }
        uVar1 = 1;
        if (1 < (int)row) {
          uVar1 = row;
        }
        local_40 = (ulong)uVar1;
        uVar4 = 0;
        local_38 = sidetosidetransforms + (long)local_50 + uVar7 * 0x60;
        while( true ) {
          if (local_48 < 0xb) {
            uVar7 = 0;
            pdVar8 = pdVar9;
            do {
              local_50 = *pdVar8;
              if (((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                   super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                 ((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                  super_TPZBaseMatrix.fCol <= (long)uVar7)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.fElem
              [(__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
               super_TPZBaseMatrix.fRow * uVar7 + uVar4] = local_50;
              uVar7 = uVar7 + 1;
              pdVar8 = pdVar8 + 3;
            } while (col != uVar7);
          }
          local_50 = *(double *)(local_38 + uVar4 * 8 + 0x48);
          if (((__return_storage_ptr__->fSum).super_TPZFMatrix<double>.super_TPZMatrix<double>.
               super_TPZBaseMatrix.fRow <= (long)uVar4) ||
             ((__return_storage_ptr__->fSum).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fCol < 1)) break;
          (__return_storage_ptr__->fSum).super_TPZFMatrix<double>.fElem[uVar4] = local_50;
          uVar4 = uVar4 + 1;
          pdVar9 = pdVar9 + 1;
          if (uVar4 == local_40) {
            return __return_storage_ptr__;
          }
        }
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      uVar7 = uVar7 + 1;
      pdVar9 = pdVar9 + 0xc;
    } while (uVar7 != uVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZTetrahedron::SideToSideTransform highside not found sidefrom ",0x40);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,sidefrom);
    pcVar6 = &local_51;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZTetrahedron::HigherDimensionSides sidefrom ",0x2e);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,sidefrom);
    pcVar6 = &local_52;
  }
  *pcVar6 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,1);
  plVar3 = (long *)std::ostream::operator<<(poVar2,sideto);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  dim = 0;
LAB_00dff72d:
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,dim);
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<> TPZTetrahedron::SideToSideTransform(int sidefrom, int sideto)
	{
		if(sidefrom <0 || sidefrom >= NSides || sideto <0 || sideto >= NSides) {
			PZError << "TPZTetrahedron::HigherDimensionSides sidefrom "<< sidefrom << 
			' ' << sideto << endl;
			return TPZTransform<>(0);
		}
		if(sidefrom == sideto) {
			return TPZTransform<>(sidedimension[sidefrom]);
		}
		if(sidefrom == NSides-1) {
			return TransformElementToSide(sideto);
		}
		int nhigh = nhighdimsides[sidefrom];
		int is;
		for(is=0; is<nhigh; is++) {
			if(highsides[sidefrom][is] == sideto) {
				int dfr = sidedimension[sidefrom];
				int dto = sidedimension[sideto];
				TPZTransform<> trans(dto,dfr);
				int i,j;
				for(i=0; i<dto; i++) {
					for(j=0; j<dfr; j++) {
						trans.Mult()(i,j) = sidetosidetransforms[sidefrom][is][j][i];
					}
					trans.Sum()(i,0) = sidetosidetransforms[sidefrom][is][3][i];
				}
				return trans;
			}
		}
		PZError << "TPZTetrahedron::SideToSideTransform highside not found sidefrom "
		<< sidefrom << ' ' << sideto << endl;
		return TPZTransform<>(0);
	}